

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O0

void command_callback(int key)

{
  undefined1 *puVar1;
  undefined1 *local_30;
  uchar *pixels;
  GLFWimage image;
  int local_10;
  int y;
  int x;
  int key_local;
  
  switch(key) {
  case 0x31:
    glfwSetInputMode(activeWindow,0x33001,0x34001);
    break;
  case 0x32:
    glfwSetInputMode(activeWindow,0x33001,0x34002);
    break;
  case 0x33:
    glfwSetInputMode(activeWindow,0x33001,0x34003);
    break;
  case 0x43:
    if (cursor == (GLFWcursor *)0x0) {
      pixels._0_4_ = cursorSize[currentSize].w;
      pixels._4_4_ = cursorSize[currentSize].h;
      image._0_8_ = malloc((long)((int)pixels * 4 * pixels._4_4_));
      local_30 = (undefined1 *)image._0_8_;
      for (image.pixels._4_4_ = 0; image.pixels._4_4_ < pixels._4_4_;
          image.pixels._4_4_ = image.pixels._4_4_ + 1) {
        for (local_10 = 0; local_10 < (int)pixels; local_10 = local_10 + 1) {
          *local_30 = 0xff;
          local_30[1] = 0;
          puVar1 = local_30 + 3;
          local_30[2] = (char)((image.pixels._4_4_ * 0xff) / pixels._4_4_);
          local_30 = local_30 + 4;
          *puVar1 = (char)((local_10 * 0xff) / (int)pixels);
        }
      }
      cursor = glfwCreateCursor((GLFWimage *)&pixels,(int)pixels / 2,pixels._4_4_ / 2);
      currentSize = (currentSize + 1) % SizeCount;
      free((void *)image._0_8_);
    }
    break;
  case 0x44:
    if (cursor != (GLFWcursor *)0x0) {
      glfwDestroyCursor(cursor);
      cursor = (GLFWcursor *)0x0;
    }
    break;
  case 0x48:
    printf("H: show this help\n");
    printf("C: call glfwCreateCursor()\n");
    printf("D: call glfwDestroyCursor()\n");
    printf("S: call glfwSetCursor()\n");
    printf("N: call glfwSetCursor() with NULL\n");
    printf("1: set GLFW_CURSOR_NORMAL\n");
    printf("2: set GLFW_CURSOR_HIDDEN\n");
    printf("3: set GLFW_CURSOR_DISABLED\n");
    printf("T: enable 3s delay for all previous commands\n");
    break;
  case 0x4e:
    glfwSetCursor(activeWindow,(GLFWcursor *)0x0);
    break;
  case 0x53:
    if (cursor == (GLFWcursor *)0x0) {
      printf("The cursor is not created\n");
    }
    else {
      glfwSetCursor(activeWindow,cursor);
    }
  }
  return;
}

Assistant:

static void command_callback(int key)
{
    switch (key)
    {
        case GLFW_KEY_H:
        {
            printf("H: show this help\n");
            printf("C: call glfwCreateCursor()\n");
            printf("D: call glfwDestroyCursor()\n");
            printf("S: call glfwSetCursor()\n");
            printf("N: call glfwSetCursor() with NULL\n");
            printf("1: set GLFW_CURSOR_NORMAL\n");
            printf("2: set GLFW_CURSOR_HIDDEN\n");
            printf("3: set GLFW_CURSOR_DISABLED\n");
            printf("T: enable 3s delay for all previous commands\n");
        }
        break;

        case GLFW_KEY_C:
        {
            int x, y;
            GLFWimage image;
            unsigned char* pixels;

            if (cursor)
              break;

            image.width = cursorSize[currentSize].w;
            image.height = cursorSize[currentSize].h;

            pixels = malloc(4 * image.width * image.height);
            image.pixels = pixels;

            for (y = 0;  y < image.height;  y++)
            {
                for (x =  0;  x < image.width;  x++)
                {
                    *pixels++ = 0xff;
                    *pixels++ = 0;
                    *pixels++ = 255 * y / image.height;
                    *pixels++ = 255 * x / image.width;
                }
            }

            cursor = glfwCreateCursor(&image, image.width / 2, image.height / 2);
            currentSize = (currentSize + 1) % SizeCount;
            free(image.pixels);
            break;
        }

        case GLFW_KEY_D:
        {
            if (cursor != NULL)
            {
                glfwDestroyCursor(cursor);
                cursor = NULL;
            }

            break;
        }

        case GLFW_KEY_S:
        {
            if (cursor != NULL)
                glfwSetCursor(activeWindow, cursor);
            else
                printf("The cursor is not created\n");

            break;
        }

        case GLFW_KEY_N:
            glfwSetCursor(activeWindow, NULL);
            break;

        case GLFW_KEY_1:
            glfwSetInputMode(activeWindow, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
            break;

        case GLFW_KEY_2:
            glfwSetInputMode(activeWindow, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
            break;

        case GLFW_KEY_3:
            glfwSetInputMode(activeWindow, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
            break;
    }
}